

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_event_loop.hpp
# Opt level: O1

void __thiscall
cppurses::detail::Timer_event_loop::Timer_event_loop
          (Timer_event_loop *this,
          function<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_()> *period_func)

{
  _Rb_tree_header *p_Var1;
  
  Event_loop::Event_loop(&this->super_Event_loop);
  (this->super_Event_loop)._vptr_Event_loop = (_func_int **)&PTR__Timer_event_loop_001669c0;
  p_Var1 = &(this->registered_widgets_)._M_t._M_impl.super__Rb_tree_header;
  (this->registered_widgets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->registered_widgets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->registered_widgets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->registered_widgets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->registered_widgets_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::function<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_()>::function
            (&this->period_func_,period_func);
  (this->last_time_).__d.__r = 0;
  return;
}

Assistant:

explicit Timer_event_loop(std::function<Period_t()> period_func)
        : period_func_{period_func}
    {}